

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

_Bool sysbvm_filesystem_isAbsolute(sysbvm_tuple_t path)

{
  _Bool _Var1;
  
  _Var1 = sysbvm_tuple_isBytes(path);
  if (((_Var1) && ((path & 0xf) == 0 && path != 0)) && (*(int *)(path + 0xc) != 0)) {
    _Var1 = *(char *)(path + 0x10) == '/';
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

SYSBVM_API bool sysbvm_filesystem_isAbsolute(sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return false;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;

#ifdef _WIN32
    return pathSize >= 2 && pathBytes[1] == ':';
#else
    return pathSize >= 1 && pathBytes[0] == '/';
#endif
}